

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBody.cpp
# Opt level: O0

void __thiscall btMultiBody::checkMotionAndSleepIfRequired(btMultiBody *this,btScalar timestep)

{
  float fVar1;
  float *pfVar2;
  btMultiBody *in_RDI;
  float in_XMM0_Da;
  int i;
  btScalar motion;
  int num_links;
  int local_18;
  float local_14;
  
  getNumLinks((btMultiBody *)0x2426ae);
  if (((in_RDI->m_canSleep & 1U) == 0) || ((gDisableDeactivation & 1U) != 0)) {
    in_RDI->m_awake = true;
    in_RDI->m_sleepTimer = 0.0;
  }
  else {
    local_14 = 0.0;
    for (local_18 = 0; local_18 < in_RDI->m_dofCount + 6; local_18 = local_18 + 1) {
      pfVar2 = btAlignedObjectArray<float>::operator[](&in_RDI->m_realBuf,local_18);
      fVar1 = *pfVar2;
      pfVar2 = btAlignedObjectArray<float>::operator[](&in_RDI->m_realBuf,local_18);
      local_14 = fVar1 * *pfVar2 + local_14;
    }
    if (0.05 <= local_14) {
      in_RDI->m_sleepTimer = 0.0;
      if ((in_RDI->m_awake & 1U) == 0) {
        wakeUp(in_RDI);
      }
    }
    else {
      in_RDI->m_sleepTimer = in_XMM0_Da + in_RDI->m_sleepTimer;
      if (2.0 < in_RDI->m_sleepTimer) {
        goToSleep(in_RDI);
      }
    }
  }
  return;
}

Assistant:

void btMultiBody::checkMotionAndSleepIfRequired(btScalar timestep)
{
	int num_links = getNumLinks();
	extern bool gDisableDeactivation;
    if (!m_canSleep || gDisableDeactivation) 
	{
		m_awake = true;
		m_sleepTimer = 0;
		return;
	}

    // motion is computed as omega^2 + v^2 + (sum of squares of joint velocities)
    btScalar motion = 0;
	{
		for (int i = 0; i < 6 + m_dofCount; ++i) 		
			motion += m_realBuf[i] * m_realBuf[i];
	}
	

    if (motion < SLEEP_EPSILON) {
        m_sleepTimer += timestep;
        if (m_sleepTimer > SLEEP_TIMEOUT) {
            goToSleep();
        }
    } else {
        m_sleepTimer = 0;
		if (!m_awake)
			wakeUp();
    }
}